

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [16];
  ushort *puVar2;
  undefined8 *puVar3;
  short *psVar4;
  int iVar5;
  char *s1;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  __m128i *palVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  parasail_result_t *result_00;
  __m128i *b;
  __m128i *palVar17;
  __m128i *palVar18;
  __m128i *palVar19;
  __m128i *b_00;
  __m128i *palVar20;
  __m128i *b_01;
  __m128i *palVar21;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  int iVar22;
  ulong uVar23;
  __m128i *palVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ulong uVar28;
  parasail_result_t *ppVar29;
  parasail_result_t *ppVar30;
  __m128i *ptr;
  int iVar31;
  int iVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  __m128i *palVar37;
  __m128i *ptr_00;
  __m128i *palVar38;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  short sVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar57;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar58 [16];
  short sVar67;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ushort uVar70;
  short sVar71;
  ushort uVar73;
  short sVar74;
  ushort uVar75;
  short sVar76;
  ushort uVar77;
  short sVar78;
  ushort uVar79;
  short sVar80;
  ushort uVar81;
  short sVar82;
  ushort uVar83;
  short sVar84;
  ushort uVar85;
  undefined1 auVar72 [16];
  short sVar86;
  short sVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  undefined1 auVar102 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i *local_1d0;
  uint local_1c8;
  __m128i *local_1c0;
  __m128i *local_1b8;
  __m128i *local_1b0;
  __m128i *local_1a8;
  __m128i *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined1 local_78 [16];
  short sVar39;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar92;
  
  s1 = profile->s1;
  ppVar6 = profile->matrix;
  result = parasail_sw_striped_profile_sse41_128_16(profile,s2,s2Len,open,gap);
  iVar15 = parasail_result_is_saturated(result);
  if (iVar15 != 0) {
    return result;
  }
  iVar15 = result->end_query;
  iVar5 = result->end_ref;
  profile_00 = parasail_profile_create_stats_sse_128_16(s1,iVar15 + 1,ppVar6);
  if (profile_00 == (parasail_profile_t *)0x0) {
    parasail_sw_stats_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar7 = (profile_00->profile16).score;
    if (pvVar7 == (void *)0x0) {
      parasail_sw_stats_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar6 = profile_00->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar34 = profile_00->s1Len;
        uVar23 = (ulong)uVar34;
        if ((int)uVar34 < 1) {
          parasail_sw_stats_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_striped_profile_sse41_128_16_cold_4();
        }
        else if (iVar5 < 0) {
          parasail_sw_stats_striped_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_striped_profile_sse41_128_16_cold_2();
        }
        else {
          if (-1 < gap) {
            pvVar8 = (profile_00->profile16).matches;
            pvVar9 = (profile_00->profile16).similar;
            iVar32 = ppVar6->max;
            result_00 = parasail_result_new_stats();
            ppVar30 = (parasail_result_t *)0x0;
            if (result_00 == (parasail_result_t *)0x0) goto LAB_0068da52;
            uVar28 = uVar23 + 7 >> 3;
            result_00->flag = result_00->flag | 0x8210804;
            b = parasail_memalign___m128i(0x10,uVar28);
            palVar17 = parasail_memalign___m128i(0x10,uVar28);
            palVar18 = parasail_memalign___m128i(0x10,uVar28);
            palVar19 = parasail_memalign___m128i(0x10,uVar28);
            b_00 = parasail_memalign___m128i(0x10,uVar28);
            palVar20 = parasail_memalign___m128i(0x10,uVar28);
            b_01 = parasail_memalign___m128i(0x10,uVar28);
            palVar21 = parasail_memalign___m128i(0x10,uVar28);
            b_02 = parasail_memalign___m128i(0x10,uVar28);
            b_03 = parasail_memalign___m128i(0x10,uVar28);
            b_04 = parasail_memalign___m128i(0x10,uVar28);
            b_05 = parasail_memalign___m128i(0x10,uVar28);
            local_1b8 = parasail_memalign___m128i(0x10,uVar28);
            local_1b0 = parasail_memalign___m128i(0x10,uVar28);
            local_1c0 = parasail_memalign___m128i(0x10,uVar28);
            local_1a0 = parasail_memalign___m128i(0x10,uVar28);
            ppVar29 = (parasail_result_t *)0x0;
            ppVar30 = (parasail_result_t *)0x0;
            if ((((((b == (__m128i *)0x0) || (palVar17 == (__m128i *)0x0)) ||
                  (ppVar30 = ppVar29, palVar18 == (__m128i *)0x0)) ||
                 ((palVar19 == (__m128i *)0x0 || (b_00 == (__m128i *)0x0)))) ||
                (((palVar20 == (__m128i *)0x0 ||
                  ((b_01 == (__m128i *)0x0 || (palVar21 == (__m128i *)0x0)))) ||
                 (b_02 == (__m128i *)0x0)))) ||
               ((((b_03 == (__m128i *)0x0 || (b_04 == (__m128i *)0x0)) || (b_05 == (__m128i *)0x0))
                || (((local_1b8 == (__m128i *)0x0 || (local_1b0 == (__m128i *)0x0)) ||
                    ((local_1c0 == (__m128i *)0x0 || (local_1a0 == (__m128i *)0x0))))))))
            goto LAB_0068da52;
            auVar43 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar41 = auVar43._0_4_;
            auVar43 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar42 = auVar43._0_4_;
            c[1] = (longlong)b_04;
            c[0] = uVar28;
            palVar24 = b_02;
            parasail_memset___m128i(b,c,(size_t)b_02);
            c_00[1] = extraout_RDX;
            c_00[0] = uVar28;
            parasail_memset___m128i(palVar18,c_00,(size_t)palVar24);
            c_01[1] = extraout_RDX_00;
            c_01[0] = uVar28;
            parasail_memset___m128i(b_00,c_01,(size_t)palVar24);
            c_02[1] = extraout_RDX_01;
            c_02[0] = uVar28;
            parasail_memset___m128i(b_01,c_02,(size_t)palVar24);
            c_03[1] = extraout_RDX_02;
            c_03[0] = uVar28;
            parasail_memset___m128i(b_02,c_03,(size_t)palVar24);
            c_04[1] = extraout_RDX_03;
            c_04[0] = uVar28;
            parasail_memset___m128i(b_03,c_04,(size_t)palVar24);
            c_05[1] = extraout_RDX_04;
            c_05[0] = uVar28;
            parasail_memset___m128i(b_04,c_05,(size_t)palVar24);
            c_06[1] = extraout_RDX_05;
            c_06[0] = uVar28;
            parasail_memset___m128i(b_05,c_06,(size_t)palVar24);
            uVar11 = (uint)uVar28;
            uVar26 = uVar11 - 1;
            local_1c8 = 0x8000;
            uVar36 = 0;
            uVar33 = 0;
            local_78 = _DAT_008d0de0;
            auVar43 = _DAT_008d0de0;
            auVar102 = _DAT_008d0de0;
            auVar94 = _DAT_008d0de0;
            do {
              local_1a8 = b_01;
              ptr = b_00;
              palVar38 = palVar18;
              palVar37 = b;
              lVar35 = (long)(int)(ppVar6->mapper[(byte)s2[uVar36]] * uVar11) * 0x10;
              iVar16 = (int)uVar36 + -2;
              iVar22 = (int)uVar33;
              b_00 = palVar20;
              palVar24 = local_1b0;
              palVar18 = local_1a0;
              b_01 = palVar21;
              if (iVar22 == iVar16) {
                b_00 = local_1c0;
                palVar24 = palVar19;
                palVar18 = palVar21;
                b_01 = local_1a0;
              }
              local_1a0 = palVar18;
              b = palVar17;
              palVar18 = palVar19;
              if (iVar22 == iVar16) {
                b = local_1b8;
                palVar18 = local_1b0;
              }
              uVar12 = local_1a8[uVar26][0];
              auVar100._0_8_ = uVar12 << 0x10;
              auVar100._8_8_ = local_1a8[uVar26][1] << 0x10 | uVar12 >> 0x30;
              auVar44 = ZEXT416(0x8000);
              auVar100 = pblendw(auVar100,auVar44,1);
              uVar12 = ptr[uVar26][0];
              auVar96._0_8_ = uVar12 << 0x10;
              auVar96._8_8_ = ptr[uVar26][1] << 0x10 | uVar12 >> 0x30;
              auVar96 = pblendw(auVar96,auVar44,1);
              uVar12 = palVar38[uVar26][0];
              auVar93._0_8_ = uVar12 << 0x10;
              auVar93._8_8_ = palVar38[uVar26][1] << 0x10 | uVar12 >> 0x30;
              auVar93 = pblendw(auVar93,auVar44,1);
              uVar12 = palVar37[uVar26][0];
              auVar107._0_8_ = uVar12 << 0x10;
              auVar107._8_8_ = palVar37[uVar26][1] << 0x10 | uVar12 >> 0x30;
              auVar44 = pblendw(auVar107,auVar44,1);
              lVar25 = 0;
              auVar107 = auVar94;
              auVar59 = auVar43;
              auVar108 = _DAT_008d1270;
              auVar109 = auVar43;
              auVar114 = auVar43;
              do {
                pauVar1 = (undefined1 (*) [16])((long)*b_02 + lVar25);
                sVar40 = *(short *)*pauVar1;
                sVar39 = *(short *)(*pauVar1 + 2);
                sVar48 = *(short *)(*pauVar1 + 4);
                sVar49 = *(short *)(*pauVar1 + 6);
                sVar50 = *(short *)(*pauVar1 + 8);
                sVar51 = *(short *)(*pauVar1 + 10);
                sVar52 = *(short *)(*pauVar1 + 0xc);
                sVar53 = *(short *)(*pauVar1 + 0xe);
                auVar45 = *pauVar1;
                auVar43 = *(undefined1 (*) [16])((long)*b_03 + lVar25);
                pauVar1 = (undefined1 (*) [16])((long)*b_04 + lVar25);
                auVar13 = *pauVar1;
                auVar94 = *pauVar1;
                auVar97 = *(undefined1 (*) [16])((long)*b_05 + lVar25);
                auVar44 = paddsw(auVar44,*(undefined1 (*) [16])((long)pvVar7 + lVar25 + lVar35));
                uVar88 = auVar44._0_2_;
                uVar70 = (ushort)((short)uVar88 < sVar40) * sVar40 |
                         ((short)uVar88 >= sVar40) * uVar88;
                uVar89 = auVar44._2_2_;
                uVar73 = (ushort)((short)uVar89 < sVar39) * sVar39 |
                         ((short)uVar89 >= sVar39) * uVar89;
                uVar90 = auVar44._4_2_;
                uVar75 = (ushort)((short)uVar90 < sVar48) * sVar48 |
                         ((short)uVar90 >= sVar48) * uVar90;
                uVar91 = auVar44._6_2_;
                uVar77 = (ushort)((short)uVar91 < sVar49) * sVar49 |
                         ((short)uVar91 >= sVar49) * uVar91;
                uVar103 = auVar44._8_2_;
                uVar79 = (ushort)((short)uVar103 < sVar50) * sVar50 |
                         ((short)uVar103 >= sVar50) * uVar103;
                uVar104 = auVar44._10_2_;
                uVar81 = (ushort)((short)uVar104 < sVar51) * sVar51 |
                         ((short)uVar104 >= sVar51) * uVar104;
                uVar105 = auVar44._12_2_;
                uVar106 = auVar44._14_2_;
                uVar83 = (ushort)((short)uVar105 < sVar52) * sVar52 |
                         ((short)uVar105 >= sVar52) * uVar105;
                uVar85 = (ushort)((short)uVar106 < sVar53) * sVar53 |
                         ((short)uVar106 >= sVar53) * uVar106;
                sVar40 = auVar114._0_2_;
                auVar55._0_2_ =
                     (ushort)((short)uVar70 < sVar40) * sVar40 | ((short)uVar70 >= sVar40) * uVar70;
                sVar39 = auVar114._2_2_;
                auVar55._2_2_ =
                     (ushort)((short)uVar73 < sVar39) * sVar39 | ((short)uVar73 >= sVar39) * uVar73;
                sVar48 = auVar114._4_2_;
                auVar55._4_2_ =
                     (ushort)((short)uVar75 < sVar48) * sVar48 | ((short)uVar75 >= sVar48) * uVar75;
                sVar49 = auVar114._6_2_;
                auVar55._6_2_ =
                     (ushort)((short)uVar77 < sVar49) * sVar49 | ((short)uVar77 >= sVar49) * uVar77;
                sVar50 = auVar114._8_2_;
                auVar55._8_2_ =
                     (ushort)((short)uVar79 < sVar50) * sVar50 | ((short)uVar79 >= sVar50) * uVar79;
                sVar51 = auVar114._10_2_;
                auVar55._10_2_ =
                     (ushort)((short)uVar81 < sVar51) * sVar51 | ((short)uVar81 >= sVar51) * uVar81;
                sVar52 = auVar114._12_2_;
                auVar55._12_2_ =
                     (ushort)((short)uVar83 < sVar52) * sVar52 | ((short)uVar83 >= sVar52) * uVar83;
                sVar53 = auVar114._14_2_;
                auVar55._14_2_ =
                     (ushort)((short)uVar85 < sVar53) * sVar53 | ((short)uVar85 >= sVar53) * uVar85;
                *(undefined1 (*) [16])((long)*b + lVar25) = auVar55;
                auVar56 = _DAT_008d0de0;
                auVar72._0_2_ = -(ushort)(sVar40 < (short)uVar70);
                auVar72._2_2_ = -(ushort)(sVar39 < (short)uVar73);
                auVar72._4_2_ = -(ushort)(sVar48 < (short)uVar75);
                auVar72._6_2_ = -(ushort)(sVar49 < (short)uVar77);
                auVar72._8_2_ = -(ushort)(sVar50 < (short)uVar79);
                auVar72._10_2_ = -(ushort)(sVar51 < (short)uVar81);
                auVar72._12_2_ = -(ushort)(sVar52 < (short)uVar83);
                auVar72._14_2_ = -(ushort)(sVar53 < (short)uVar85);
                auVar111 = pblendvb(auVar59,auVar43,auVar72);
                auVar44 = paddsw(auVar93,*(undefined1 (*) [16])((long)pvVar8 + lVar25 + lVar35));
                auVar58._0_2_ = -(ushort)(uVar88 == auVar55._0_2_);
                auVar58._2_2_ = -(ushort)(uVar89 == auVar55._2_2_);
                auVar58._4_2_ = -(ushort)(uVar90 == auVar55._4_2_);
                auVar58._6_2_ = -(ushort)(uVar91 == auVar55._6_2_);
                auVar58._8_2_ = -(ushort)(uVar103 == auVar55._8_2_);
                auVar58._10_2_ = -(ushort)(uVar104 == auVar55._10_2_);
                auVar58._12_2_ = -(ushort)(uVar105 == auVar55._12_2_);
                auVar58._14_2_ = -(ushort)(uVar106 == auVar55._14_2_);
                auVar44 = pblendvb(auVar111,auVar44,auVar58);
                auVar68._0_2_ = -(ushort)(auVar55._0_2_ == (ushort)DAT_008d0de0);
                auVar68._2_2_ = -(ushort)(auVar55._2_2_ == DAT_008d0de0._2_2_);
                auVar68._4_2_ = -(ushort)(auVar55._4_2_ == DAT_008d0de0._4_2_);
                auVar68._6_2_ = -(ushort)(auVar55._6_2_ == DAT_008d0de0._6_2_);
                auVar68._8_2_ = -(ushort)(auVar55._8_2_ == DAT_008d0de0._8_2_);
                auVar68._10_2_ = -(ushort)(auVar55._10_2_ == DAT_008d0de0._10_2_);
                auVar68._12_2_ = -(ushort)(auVar55._12_2_ == DAT_008d0de0._12_2_);
                auVar68._14_2_ = -(ushort)(auVar55._14_2_ == DAT_008d0de0._14_2_);
                auVar112 = pblendvb(auVar44,_DAT_008d0de0,auVar68);
                *(undefined1 (*) [16])((long)*palVar18 + lVar25) = auVar112;
                auVar94 = pblendvb(auVar109,auVar94,auVar72);
                auVar44 = paddsw(auVar96,*(undefined1 (*) [16])((long)pvVar9 + lVar25 + lVar35));
                auVar94 = pblendvb(auVar94,auVar44,auVar58);
                auVar95 = pblendvb(auVar94,auVar56,auVar68);
                *(undefined1 (*) [16])((long)*b_00 + lVar25) = auVar95;
                auVar44 = pblendvb(auVar108,auVar97,auVar72);
                auVar94 = pmovsxbw(auVar43,0x101010101010101);
                auVar94 = paddsw(auVar100,auVar94);
                auVar94 = pblendvb(auVar44,auVar94,auVar58);
                auVar100 = pblendvb(auVar94,auVar56,auVar68);
                *(undefined1 (*) [16])((long)*b_01 + lVar25) = auVar100;
                sVar40 = auVar100._0_2_;
                sVar39 = auVar95._0_2_;
                uVar79 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar100._2_2_;
                sVar39 = auVar95._2_2_;
                uVar103 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar100._4_2_;
                sVar39 = auVar95._4_2_;
                uVar81 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar100._6_2_;
                sVar39 = auVar95._6_2_;
                uVar104 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar100._8_2_;
                sVar39 = auVar95._8_2_;
                uVar83 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar100._10_2_;
                sVar39 = auVar95._10_2_;
                uVar105 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar100._12_2_;
                sVar39 = auVar95._12_2_;
                sVar48 = auVar95._14_2_;
                uVar85 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                sVar40 = auVar100._14_2_;
                uVar106 = (ushort)(sVar48 < sVar40) * sVar40 | (ushort)(sVar48 >= sVar40) * sVar48;
                sVar40 = auVar107._0_2_;
                auVar94._0_2_ =
                     (sVar40 < (short)auVar55._0_2_) * auVar55._0_2_ |
                     (ushort)(sVar40 >= (short)auVar55._0_2_) * sVar40;
                sVar40 = auVar107._2_2_;
                auVar94._2_2_ =
                     (sVar40 < (short)auVar55._2_2_) * auVar55._2_2_ |
                     (ushort)(sVar40 >= (short)auVar55._2_2_) * sVar40;
                sVar40 = auVar107._4_2_;
                auVar94._4_2_ =
                     (sVar40 < (short)auVar55._4_2_) * auVar55._4_2_ |
                     (ushort)(sVar40 >= (short)auVar55._4_2_) * sVar40;
                sVar40 = auVar107._6_2_;
                auVar94._6_2_ =
                     (sVar40 < (short)auVar55._6_2_) * auVar55._6_2_ |
                     (ushort)(sVar40 >= (short)auVar55._6_2_) * sVar40;
                sVar40 = auVar107._8_2_;
                auVar94._8_2_ =
                     (sVar40 < (short)auVar55._8_2_) * auVar55._8_2_ |
                     (ushort)(sVar40 >= (short)auVar55._8_2_) * sVar40;
                sVar40 = auVar107._10_2_;
                auVar94._10_2_ =
                     (sVar40 < (short)auVar55._10_2_) * auVar55._10_2_ |
                     (ushort)(sVar40 >= (short)auVar55._10_2_) * sVar40;
                sVar40 = auVar107._12_2_;
                sVar39 = auVar107._14_2_;
                auVar94._12_2_ =
                     (sVar40 < (short)auVar55._12_2_) * auVar55._12_2_ |
                     (ushort)(sVar40 >= (short)auVar55._12_2_) * sVar40;
                auVar94._14_2_ =
                     (sVar39 < (short)auVar55._14_2_) * auVar55._14_2_ |
                     (ushort)(sVar39 >= (short)auVar55._14_2_) * sVar39;
                auVar111._4_4_ = uVar41;
                auVar111._0_4_ = uVar41;
                auVar111._8_4_ = uVar41;
                auVar111._12_4_ = uVar41;
                auVar93 = psubsw(auVar55,auVar111);
                auVar44._4_4_ = uVar42;
                auVar44._0_4_ = uVar42;
                auVar44._8_4_ = uVar42;
                auVar44._12_4_ = uVar42;
                auVar96 = psubsw(auVar45,auVar44);
                sVar39 = auVar93._0_2_;
                sVar57 = auVar96._0_2_;
                auVar45._0_2_ = -(ushort)(sVar57 < sVar39);
                sVar48 = auVar93._2_2_;
                sVar61 = auVar96._2_2_;
                auVar45._2_2_ = -(ushort)(sVar61 < sVar48);
                sVar49 = auVar93._4_2_;
                sVar62 = auVar96._4_2_;
                auVar45._4_2_ = -(ushort)(sVar62 < sVar49);
                sVar50 = auVar93._6_2_;
                sVar63 = auVar96._6_2_;
                auVar45._6_2_ = -(ushort)(sVar63 < sVar50);
                sVar51 = auVar93._8_2_;
                sVar64 = auVar96._8_2_;
                auVar45._8_2_ = -(ushort)(sVar64 < sVar51);
                sVar52 = auVar93._10_2_;
                sVar65 = auVar96._10_2_;
                auVar45._10_2_ = -(ushort)(sVar65 < sVar52);
                sVar53 = auVar93._12_2_;
                sVar66 = auVar96._12_2_;
                sVar54 = auVar93._14_2_;
                auVar45._12_2_ = -(ushort)(sVar66 < sVar53);
                sVar67 = auVar96._14_2_;
                auVar45._14_2_ = -(ushort)(sVar67 < sVar54);
                auVar93 = pblendvb(auVar43,auVar112,auVar45);
                auVar107 = pblendvb(auVar13,auVar95,auVar45);
                auVar96 = pmovsxbw(auVar56,0x101010101010101);
                auVar43 = paddsw(auVar97,auVar96);
                auVar100 = paddsw(auVar100,auVar96);
                auVar96 = pblendvb(auVar43,auVar100,auVar45);
                auVar44 = psubsw(auVar114,auVar44);
                sVar71 = auVar44._0_2_;
                auVar43._0_2_ = -(ushort)(sVar71 < sVar39);
                sVar74 = auVar44._2_2_;
                auVar43._2_2_ = -(ushort)(sVar74 < sVar48);
                sVar76 = auVar44._4_2_;
                auVar43._4_2_ = -(ushort)(sVar76 < sVar49);
                sVar78 = auVar44._6_2_;
                auVar43._6_2_ = -(ushort)(sVar78 < sVar50);
                sVar80 = auVar44._8_2_;
                auVar43._8_2_ = -(ushort)(sVar80 < sVar51);
                sVar82 = auVar44._10_2_;
                auVar43._10_2_ = -(ushort)(sVar82 < sVar52);
                sVar84 = auVar44._12_2_;
                auVar43._12_2_ = -(ushort)(sVar84 < sVar53);
                sVar86 = auVar44._14_2_;
                auVar43._14_2_ = -(ushort)(sVar86 < sVar54);
                auVar59 = pblendvb(auVar59,auVar112,auVar43);
                sVar40 = auVar112._0_2_;
                sVar87 = auVar102._0_2_;
                uVar70 = (ushort)(sVar87 < sVar40) * sVar40 | (ushort)(sVar87 >= sVar40) * sVar87;
                sVar40 = auVar112._2_2_;
                sVar87 = auVar102._2_2_;
                uVar88 = (ushort)(sVar87 < sVar40) * sVar40 | (ushort)(sVar87 >= sVar40) * sVar87;
                sVar40 = auVar112._4_2_;
                sVar87 = auVar102._4_2_;
                uVar73 = (ushort)(sVar87 < sVar40) * sVar40 | (ushort)(sVar87 >= sVar40) * sVar87;
                sVar40 = auVar112._6_2_;
                sVar87 = auVar102._6_2_;
                uVar89 = (ushort)(sVar87 < sVar40) * sVar40 | (ushort)(sVar87 >= sVar40) * sVar87;
                sVar40 = auVar112._8_2_;
                sVar87 = auVar102._8_2_;
                uVar75 = (ushort)(sVar87 < sVar40) * sVar40 | (ushort)(sVar87 >= sVar40) * sVar87;
                sVar40 = auVar112._10_2_;
                sVar87 = auVar102._10_2_;
                uVar90 = (ushort)(sVar87 < sVar40) * sVar40 | (ushort)(sVar87 >= sVar40) * sVar87;
                sVar40 = auVar112._12_2_;
                sVar87 = auVar102._12_2_;
                sVar92 = auVar102._14_2_;
                uVar77 = (ushort)(sVar87 < sVar40) * sVar40 | (ushort)(sVar87 >= sVar40) * sVar87;
                sVar40 = auVar112._14_2_;
                uVar91 = (ushort)(sVar92 < sVar40) * sVar40 | (ushort)(sVar92 >= sVar40) * sVar92;
                auVar102._0_2_ =
                     ((short)uVar79 < (short)uVar70) * uVar70 |
                     ((short)uVar79 >= (short)uVar70) * uVar79;
                auVar102._2_2_ =
                     ((short)uVar103 < (short)uVar88) * uVar88 |
                     ((short)uVar103 >= (short)uVar88) * uVar103;
                auVar102._4_2_ =
                     ((short)uVar81 < (short)uVar73) * uVar73 |
                     ((short)uVar81 >= (short)uVar73) * uVar81;
                auVar102._6_2_ =
                     ((short)uVar104 < (short)uVar89) * uVar89 |
                     ((short)uVar104 >= (short)uVar89) * uVar104;
                auVar102._8_2_ =
                     ((short)uVar83 < (short)uVar75) * uVar75 |
                     ((short)uVar83 >= (short)uVar75) * uVar83;
                auVar102._10_2_ =
                     ((short)uVar105 < (short)uVar90) * uVar90 |
                     ((short)uVar105 >= (short)uVar90) * uVar105;
                auVar102._12_2_ =
                     ((short)uVar85 < (short)uVar77) * uVar77 |
                     ((short)uVar85 >= (short)uVar77) * uVar85;
                auVar102._14_2_ =
                     ((short)uVar106 < (short)uVar91) * uVar91 |
                     ((short)uVar106 >= (short)uVar91) * uVar106;
                puVar2 = (ushort *)((long)*b_02 + lVar25);
                *puVar2 = (ushort)(sVar39 < sVar57) * sVar57 | (ushort)(sVar39 >= sVar57) * sVar39;
                puVar2[1] = (ushort)(sVar48 < sVar61) * sVar61 | (ushort)(sVar48 >= sVar61) * sVar48
                ;
                puVar2[2] = (ushort)(sVar49 < sVar62) * sVar62 | (ushort)(sVar49 >= sVar62) * sVar49
                ;
                puVar2[3] = (ushort)(sVar50 < sVar63) * sVar63 | (ushort)(sVar50 >= sVar63) * sVar50
                ;
                puVar2[4] = (ushort)(sVar51 < sVar64) * sVar64 | (ushort)(sVar51 >= sVar64) * sVar51
                ;
                puVar2[5] = (ushort)(sVar52 < sVar65) * sVar65 | (ushort)(sVar52 >= sVar65) * sVar52
                ;
                puVar2[6] = (ushort)(sVar53 < sVar66) * sVar66 | (ushort)(sVar53 >= sVar66) * sVar53
                ;
                puVar2[7] = (ushort)(sVar54 < sVar67) * sVar67 | (ushort)(sVar54 >= sVar67) * sVar54
                ;
                local_198 = auVar93._0_8_;
                uStack_190 = auVar93._8_8_;
                puVar3 = (undefined8 *)((long)*b_03 + lVar25);
                *puVar3 = local_198;
                puVar3[1] = uStack_190;
                *(undefined1 (*) [16])((long)*b_04 + lVar25) = auVar107;
                *(undefined1 (*) [16])((long)*b_05 + lVar25) = auVar96;
                auVar114._0_2_ =
                     (ushort)(sVar39 < sVar71) * sVar71 | (ushort)(sVar39 >= sVar71) * sVar39;
                auVar114._2_2_ =
                     (ushort)(sVar48 < sVar74) * sVar74 | (ushort)(sVar48 >= sVar74) * sVar48;
                auVar114._4_2_ =
                     (ushort)(sVar49 < sVar76) * sVar76 | (ushort)(sVar49 >= sVar76) * sVar49;
                auVar114._6_2_ =
                     (ushort)(sVar50 < sVar78) * sVar78 | (ushort)(sVar50 >= sVar78) * sVar50;
                auVar114._8_2_ =
                     (ushort)(sVar51 < sVar80) * sVar80 | (ushort)(sVar51 >= sVar80) * sVar51;
                auVar114._10_2_ =
                     (ushort)(sVar52 < sVar82) * sVar82 | (ushort)(sVar52 >= sVar82) * sVar52;
                auVar114._12_2_ =
                     (ushort)(sVar53 < sVar84) * sVar84 | (ushort)(sVar53 >= sVar84) * sVar53;
                auVar114._14_2_ =
                     (ushort)(sVar54 < sVar86) * sVar86 | (ushort)(sVar54 >= sVar86) * sVar54;
                auVar109 = pblendvb(auVar109,auVar95,auVar43);
                auVar44 = paddsw(auVar108,_DAT_008d0b80);
                auVar108 = pblendvb(auVar44,auVar100,auVar43);
                auVar44 = *(undefined1 (*) [16])((long)*palVar37 + lVar25);
                auVar93 = *(undefined1 (*) [16])((long)*palVar38 + lVar25);
                auVar96 = *(undefined1 (*) [16])((long)*ptr + lVar25);
                auVar100 = *(undefined1 (*) [16])((long)*local_1a8 + lVar25);
                lVar25 = lVar25 + 0x10;
                auVar107 = auVar94;
              } while (uVar28 << 4 != lVar25);
              if (iVar22 == iVar16) {
                local_1b8 = palVar17;
                local_1c0 = palVar20;
              }
              iVar16 = 0;
              auVar13._4_4_ = uVar41;
              auVar13._0_4_ = uVar41;
              auVar13._8_4_ = uVar41;
              auVar13._12_4_ = uVar41;
              auVar97._4_4_ = uVar42;
              auVar97._0_4_ = uVar42;
              auVar97._8_4_ = uVar42;
              auVar97._12_4_ = uVar42;
              do {
                auVar112._0_8_ = auVar108._0_8_ << 0x10;
                auVar112._8_8_ = auVar108._8_8_ << 0x10 | auVar108._0_8_ >> 0x30;
                auVar108 = pblendw(auVar112,_DAT_008d1280,1);
                auVar110._0_8_ = auVar109._0_8_ << 0x10;
                auVar110._8_8_ = auVar109._8_8_ << 0x10 | auVar109._0_8_ >> 0x30;
                auVar43 = ZEXT416(0x8000);
                auVar109 = pblendw(auVar110,auVar43,1);
                auVar95._0_8_ = auVar59._0_8_ << 0x10;
                auVar95._8_8_ = auVar59._8_8_ << 0x10 | auVar59._0_8_ >> 0x30;
                auVar59 = pblendw(auVar95,auVar43,1);
                auVar113._0_8_ = auVar114._0_8_ << 0x10;
                auVar113._8_8_ = auVar114._8_8_ << 0x10 | auVar114._0_8_ >> 0x30;
                auVar114 = pblendw(auVar113,auVar43,1);
                uVar12 = palVar37[uVar26][0];
                auVar56._0_8_ = uVar12 << 0x10;
                auVar56._8_8_ = palVar37[uVar26][1] << 0x10 | uVar12 >> 0x30;
                auVar44 = pblendw(auVar56,auVar43,1);
                lVar25 = 0;
                auVar93 = auVar94;
                do {
                  auVar44 = paddsw(auVar44,*(undefined1 (*) [16])((long)pvVar7 + lVar25 + lVar35));
                  psVar4 = (short *)((long)*b + lVar25);
                  sVar54 = *psVar4;
                  sVar57 = psVar4[1];
                  sVar61 = psVar4[2];
                  sVar62 = psVar4[3];
                  sVar63 = psVar4[4];
                  sVar64 = psVar4[5];
                  sVar65 = psVar4[6];
                  sVar66 = psVar4[7];
                  sVar40 = auVar114._0_2_;
                  auVar60._0_2_ =
                       (ushort)(sVar54 < sVar40) * sVar40 | (ushort)(sVar54 >= sVar40) * sVar54;
                  sVar39 = auVar114._2_2_;
                  auVar60._2_2_ =
                       (ushort)(sVar57 < sVar39) * sVar39 | (ushort)(sVar57 >= sVar39) * sVar57;
                  sVar48 = auVar114._4_2_;
                  auVar60._4_2_ =
                       (ushort)(sVar61 < sVar48) * sVar48 | (ushort)(sVar61 >= sVar48) * sVar61;
                  sVar49 = auVar114._6_2_;
                  auVar60._6_2_ =
                       (ushort)(sVar62 < sVar49) * sVar49 | (ushort)(sVar62 >= sVar49) * sVar62;
                  sVar50 = auVar114._8_2_;
                  auVar60._8_2_ =
                       (ushort)(sVar63 < sVar50) * sVar50 | (ushort)(sVar63 >= sVar50) * sVar63;
                  sVar51 = auVar114._10_2_;
                  auVar60._10_2_ =
                       (ushort)(sVar64 < sVar51) * sVar51 | (ushort)(sVar64 >= sVar51) * sVar64;
                  sVar52 = auVar114._12_2_;
                  auVar60._12_2_ =
                       (ushort)(sVar65 < sVar52) * sVar52 | (ushort)(sVar65 >= sVar52) * sVar65;
                  sVar53 = auVar114._14_2_;
                  auVar60._14_2_ =
                       (ushort)(sVar66 < sVar53) * sVar53 | (ushort)(sVar66 >= sVar53) * sVar66;
                  *(undefined1 (*) [16])((long)*b + lVar25) = auVar60;
                  auVar69._0_2_ = -(ushort)(auVar60._0_2_ == auVar44._0_2_);
                  auVar69._2_2_ = -(ushort)(auVar60._2_2_ == auVar44._2_2_);
                  auVar69._4_2_ = -(ushort)(auVar60._4_2_ == auVar44._4_2_);
                  auVar69._6_2_ = -(ushort)(auVar60._6_2_ == auVar44._6_2_);
                  auVar69._8_2_ = -(ushort)(auVar60._8_2_ == auVar44._8_2_);
                  auVar69._10_2_ = -(ushort)(auVar60._10_2_ == auVar44._10_2_);
                  auVar69._12_2_ = -(ushort)(auVar60._12_2_ == auVar44._12_2_);
                  auVar69._14_2_ = -(ushort)(auVar60._14_2_ == auVar44._14_2_);
                  auVar46._0_2_ = -(ushort)(sVar40 < sVar54);
                  auVar46._2_2_ = -(ushort)(sVar39 < sVar57);
                  auVar46._4_2_ = -(ushort)(sVar48 < sVar61);
                  auVar46._6_2_ = -(ushort)(sVar49 < sVar62);
                  auVar46._8_2_ = -(ushort)(sVar50 < sVar63);
                  auVar46._10_2_ = -(ushort)(sVar51 < sVar64);
                  auVar46._12_2_ = -(ushort)(sVar52 < sVar65);
                  auVar46._14_2_ = -(ushort)(sVar53 < sVar66);
                  auVar46 = auVar46 | auVar69;
                  auVar94 = pblendvb(auVar59,*(undefined1 (*) [16])((long)*palVar18 + lVar25),
                                     auVar46);
                  *(undefined1 (*) [16])((long)*palVar18 + lVar25) = auVar94;
                  auVar96 = pblendvb(auVar109,*(undefined1 (*) [16])((long)*b_00 + lVar25),auVar46);
                  *(undefined1 (*) [16])((long)*b_00 + lVar25) = auVar96;
                  auVar100 = pblendvb(auVar108,*(undefined1 (*) [16])((long)*b_01 + lVar25),auVar46)
                  ;
                  auVar43 = psubsw(auVar60,auVar13);
                  auVar107 = psubsw(auVar114,auVar97);
                  sVar40 = auVar43._0_2_;
                  sVar54 = auVar107._0_2_;
                  auVar98._0_2_ = -(ushort)(sVar54 == sVar40);
                  sVar39 = auVar43._2_2_;
                  sVar57 = auVar107._2_2_;
                  auVar98._2_2_ = -(ushort)(sVar57 == sVar39);
                  sVar48 = auVar43._4_2_;
                  sVar61 = auVar107._4_2_;
                  auVar98._4_2_ = -(ushort)(sVar61 == sVar48);
                  sVar49 = auVar43._6_2_;
                  sVar62 = auVar107._6_2_;
                  auVar98._6_2_ = -(ushort)(sVar62 == sVar49);
                  sVar50 = auVar43._8_2_;
                  sVar63 = auVar107._8_2_;
                  auVar98._8_2_ = -(ushort)(sVar63 == sVar50);
                  sVar51 = auVar43._10_2_;
                  sVar64 = auVar107._10_2_;
                  auVar98._10_2_ = -(ushort)(sVar64 == sVar51);
                  sVar52 = auVar43._12_2_;
                  sVar65 = auVar107._12_2_;
                  sVar66 = auVar107._14_2_;
                  auVar98._12_2_ = -(ushort)(sVar65 == sVar52);
                  sVar53 = auVar43._14_2_;
                  auVar98._14_2_ = -(ushort)(sVar66 == sVar53);
                  auVar101._0_2_ = -(ushort)(-0x8000 < sVar54);
                  auVar101._2_2_ = -(ushort)(-0x8000 < sVar57);
                  auVar101._4_2_ = -(ushort)(-0x8000 < sVar61);
                  auVar101._6_2_ = -(ushort)(-0x8000 < sVar62);
                  auVar101._8_2_ = -(ushort)(-0x8000 < sVar63);
                  auVar101._10_2_ = -(ushort)(-0x8000 < sVar64);
                  auVar101._12_2_ = -(ushort)(-0x8000 < sVar65);
                  auVar101._14_2_ = -(ushort)(-0x8000 < sVar66);
                  auVar99._0_2_ = -(ushort)(sVar40 < sVar54);
                  auVar99._2_2_ = -(ushort)(sVar39 < sVar57);
                  auVar99._4_2_ = -(ushort)(sVar48 < sVar61);
                  auVar99._6_2_ = -(ushort)(sVar49 < sVar62);
                  auVar99._8_2_ = -(ushort)(sVar50 < sVar63);
                  auVar99._10_2_ = -(ushort)(sVar51 < sVar64);
                  auVar99._12_2_ = -(ushort)(sVar52 < sVar65);
                  auVar99._14_2_ = -(ushort)(sVar53 < sVar66);
                  auVar111 = auVar101 & auVar98 | auVar99;
                  *(undefined1 (*) [16])((long)*b_01 + lVar25) = auVar100;
                  auVar43 = _DAT_008d0de0;
                  if ((((((((((((((((auVar111 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar111 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar111 >> 0x17 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar111 >> 0x27 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                               (auVar111 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar111 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar111 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar111 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar111 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar111 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar111 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar111 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar111 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar111[0xf]) {
                    iVar22 = 0x1e;
                  }
                  else {
                    auVar47._0_2_ = -(ushort)(sVar54 < sVar40);
                    auVar47._2_2_ = -(ushort)(sVar57 < sVar39);
                    auVar47._4_2_ = -(ushort)(sVar61 < sVar48);
                    auVar47._6_2_ = -(ushort)(sVar62 < sVar49);
                    auVar47._8_2_ = -(ushort)(sVar63 < sVar50);
                    auVar47._10_2_ = -(ushort)(sVar64 < sVar51);
                    auVar47._12_2_ = -(ushort)(sVar65 < sVar52);
                    auVar47._14_2_ = -(ushort)(sVar66 < sVar53);
                    auVar59 = pblendvb(auVar59,auVar94,auVar47);
                    auVar109 = pblendvb(auVar109,auVar96,auVar47);
                    auVar44 = pmovsxbw(auVar99,0x101010101010101);
                    auVar108 = paddsw(auVar108,auVar44);
                    auVar44 = paddsw(auVar100,auVar44);
                    auVar108 = pblendvb(auVar108,auVar44,auVar47);
                    auVar44 = *(undefined1 (*) [16])((long)*palVar37 + lVar25);
                    iVar22 = 0;
                    auVar114 = auVar107;
                  }
                  sVar40 = auVar94._0_2_;
                  sVar39 = auVar102._0_2_;
                  uVar70 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar94._2_2_;
                  sVar39 = auVar102._2_2_;
                  uVar88 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar94._4_2_;
                  sVar39 = auVar102._4_2_;
                  uVar73 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar94._6_2_;
                  sVar39 = auVar102._6_2_;
                  uVar89 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar94._8_2_;
                  sVar39 = auVar102._8_2_;
                  uVar75 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar94._10_2_;
                  sVar39 = auVar102._10_2_;
                  uVar90 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar94._12_2_;
                  sVar39 = auVar102._12_2_;
                  sVar48 = auVar102._14_2_;
                  uVar77 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar94._14_2_;
                  uVar91 = (ushort)(sVar48 < sVar40) * sVar40 | (ushort)(sVar48 >= sVar40) * sVar48;
                  sVar40 = auVar100._0_2_;
                  sVar39 = auVar96._0_2_;
                  uVar79 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar100._2_2_;
                  sVar39 = auVar96._2_2_;
                  uVar103 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39
                  ;
                  sVar40 = auVar100._4_2_;
                  sVar39 = auVar96._4_2_;
                  uVar81 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar100._6_2_;
                  sVar39 = auVar96._6_2_;
                  uVar104 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39
                  ;
                  sVar40 = auVar100._8_2_;
                  sVar39 = auVar96._8_2_;
                  uVar83 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar100._10_2_;
                  sVar39 = auVar96._10_2_;
                  uVar105 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39
                  ;
                  sVar40 = auVar100._12_2_;
                  sVar39 = auVar96._12_2_;
                  sVar48 = auVar96._14_2_;
                  uVar85 = (ushort)(sVar39 < sVar40) * sVar40 | (ushort)(sVar39 >= sVar40) * sVar39;
                  sVar40 = auVar100._14_2_;
                  uVar106 = (ushort)(sVar48 < sVar40) * sVar40 | (ushort)(sVar48 >= sVar40) * sVar48
                  ;
                  auVar102._0_2_ =
                       ((short)uVar79 < (short)uVar70) * uVar70 |
                       ((short)uVar79 >= (short)uVar70) * uVar79;
                  auVar102._2_2_ =
                       ((short)uVar103 < (short)uVar88) * uVar88 |
                       ((short)uVar103 >= (short)uVar88) * uVar103;
                  auVar102._4_2_ =
                       ((short)uVar81 < (short)uVar73) * uVar73 |
                       ((short)uVar81 >= (short)uVar73) * uVar81;
                  auVar102._6_2_ =
                       ((short)uVar104 < (short)uVar89) * uVar89 |
                       ((short)uVar104 >= (short)uVar89) * uVar104;
                  auVar102._8_2_ =
                       ((short)uVar83 < (short)uVar75) * uVar75 |
                       ((short)uVar83 >= (short)uVar75) * uVar83;
                  auVar102._10_2_ =
                       ((short)uVar105 < (short)uVar90) * uVar90 |
                       ((short)uVar105 >= (short)uVar90) * uVar105;
                  auVar102._12_2_ =
                       ((short)uVar85 < (short)uVar77) * uVar77 |
                       ((short)uVar85 >= (short)uVar77) * uVar85;
                  auVar102._14_2_ =
                       ((short)uVar106 < (short)uVar91) * uVar91 |
                       ((short)uVar106 >= (short)uVar91) * uVar106;
                  sVar40 = auVar93._0_2_;
                  auVar94._0_2_ =
                       (sVar40 < (short)auVar60._0_2_) * auVar60._0_2_ |
                       (ushort)(sVar40 >= (short)auVar60._0_2_) * sVar40;
                  sVar40 = auVar93._2_2_;
                  auVar94._2_2_ =
                       (sVar40 < (short)auVar60._2_2_) * auVar60._2_2_ |
                       (ushort)(sVar40 >= (short)auVar60._2_2_) * sVar40;
                  sVar40 = auVar93._4_2_;
                  auVar94._4_2_ =
                       (sVar40 < (short)auVar60._4_2_) * auVar60._4_2_ |
                       (ushort)(sVar40 >= (short)auVar60._4_2_) * sVar40;
                  sVar40 = auVar93._6_2_;
                  auVar94._6_2_ =
                       (sVar40 < (short)auVar60._6_2_) * auVar60._6_2_ |
                       (ushort)(sVar40 >= (short)auVar60._6_2_) * sVar40;
                  sVar40 = auVar93._8_2_;
                  auVar94._8_2_ =
                       (sVar40 < (short)auVar60._8_2_) * auVar60._8_2_ |
                       (ushort)(sVar40 >= (short)auVar60._8_2_) * sVar40;
                  sVar40 = auVar93._10_2_;
                  auVar94._10_2_ =
                       (sVar40 < (short)auVar60._10_2_) * auVar60._10_2_ |
                       (ushort)(sVar40 >= (short)auVar60._10_2_) * sVar40;
                  sVar40 = auVar93._12_2_;
                  sVar39 = auVar93._14_2_;
                  auVar94._12_2_ =
                       (sVar40 < (short)auVar60._12_2_) * auVar60._12_2_ |
                       (ushort)(sVar40 >= (short)auVar60._12_2_) * sVar40;
                  auVar94._14_2_ =
                       (sVar39 < (short)auVar60._14_2_) * auVar60._14_2_ |
                       (ushort)(sVar39 >= (short)auVar60._14_2_) * sVar39;
                  if ((((((((((((((((auVar111 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar111 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar111 >> 0x17 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar111 >> 0x27 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                               (auVar111 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar111 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar111 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar111 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar111 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar111 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar111 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar111 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar111 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar111[0xf]) goto LAB_0068d63a;
                  lVar25 = lVar25 + 0x10;
                  auVar93 = auVar94;
                } while (uVar28 << 4 != lVar25);
                iVar22 = 0;
LAB_0068d63a:
                if (iVar22 != 0) {
                  if (iVar22 != 0x1e) {
                    bVar10 = false;
                    goto LAB_0068d72d;
                  }
                  break;
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 != 8);
              auVar59._0_2_ = -(ushort)((short)local_78._0_2_ < (short)auVar94._0_2_);
              auVar59._2_2_ = -(ushort)((short)local_78._2_2_ < (short)auVar94._2_2_);
              auVar59._4_2_ = -(ushort)((short)local_78._4_2_ < (short)auVar94._4_2_);
              auVar59._6_2_ = -(ushort)((short)local_78._6_2_ < (short)auVar94._6_2_);
              auVar59._8_2_ = -(ushort)((short)local_78._8_2_ < (short)auVar94._8_2_);
              auVar59._10_2_ = -(ushort)((short)local_78._10_2_ < (short)auVar94._10_2_);
              auVar59._12_2_ = -(ushort)((short)local_78._12_2_ < (short)auVar94._12_2_);
              auVar59._14_2_ = -(ushort)((short)local_78._14_2_ < (short)auVar94._14_2_);
              bVar10 = true;
              if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar59 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar59 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar59 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar59 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar59 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar59 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59._14_2_ >> 7 & 1) != 0) || (auVar59._14_2_ & 0x8000) != 0) {
                auVar44 = phminposuw(auVar94 ^ _DAT_008d1290);
                local_1c8 = auVar44._0_4_ ^ 0x7fff;
                bVar10 = (short)local_1c8 <= (short)(0x7ffe - (short)iVar32);
                if (bVar10) {
                  uVar70 = ((short)auVar94._8_2_ < (short)auVar94._0_2_) * auVar94._0_2_ |
                           ((short)auVar94._8_2_ >= (short)auVar94._0_2_) * auVar94._8_2_;
                  uVar88 = ((short)auVar94._10_2_ < (short)auVar94._2_2_) * auVar94._2_2_ |
                           ((short)auVar94._10_2_ >= (short)auVar94._2_2_) * auVar94._10_2_;
                  uVar73 = ((short)auVar94._12_2_ < (short)auVar94._4_2_) * auVar94._4_2_ |
                           ((short)auVar94._12_2_ >= (short)auVar94._4_2_) * auVar94._12_2_;
                  uVar89 = ((short)auVar94._14_2_ < (short)auVar94._6_2_) * auVar94._6_2_ |
                           ((short)auVar94._14_2_ >= (short)auVar94._6_2_) * auVar94._14_2_;
                  sVar39 = (0 < (short)auVar94._8_2_) * auVar94._8_2_;
                  sVar40 = (0 < (short)auVar94._10_2_) * auVar94._10_2_;
                  sVar49 = (0 < (short)auVar94._12_2_) * auVar94._12_2_;
                  sVar48 = (0 < (short)auVar94._14_2_) * auVar94._14_2_;
                  uVar70 = ((short)uVar73 < (short)uVar70) * uVar70 |
                           ((short)uVar73 >= (short)uVar70) * uVar73;
                  uVar88 = ((short)uVar89 < (short)uVar88) * uVar88 |
                           ((short)uVar89 >= (short)uVar88) * uVar89;
                  uVar73 = (sVar39 < (short)uVar73) * uVar73 |
                           (ushort)(sVar39 >= (short)uVar73) * sVar39;
                  uVar89 = (sVar40 < (short)uVar89) * uVar89 |
                           (ushort)(sVar40 >= (short)uVar89) * sVar40;
                  uVar75 = (ushort)(sVar49 < sVar39) * sVar39 | (ushort)(sVar49 >= sVar39) * sVar49;
                  uVar90 = (ushort)(sVar48 < sVar40) * sVar40 | (ushort)(sVar48 >= sVar40) * sVar48;
                  sVar49 = (ushort)(0 < sVar49) * sVar49;
                  sVar48 = (ushort)(0 < sVar48) * sVar48;
                  auVar108._0_2_ =
                       ((short)uVar88 < (short)uVar70) * uVar70 |
                       ((short)uVar88 >= (short)uVar70) * uVar88;
                  auVar108._2_2_ =
                       ((short)uVar73 < (short)uVar88) * uVar88 |
                       ((short)uVar73 >= (short)uVar88) * uVar73;
                  auVar108._4_2_ =
                       ((short)uVar89 < (short)uVar73) * uVar73 |
                       ((short)uVar89 >= (short)uVar73) * uVar89;
                  auVar108._6_2_ =
                       ((short)uVar75 < (short)uVar89) * uVar89 |
                       ((short)uVar75 >= (short)uVar89) * uVar75;
                  auVar108._8_2_ =
                       ((short)uVar90 < (short)uVar75) * uVar75 |
                       ((short)uVar90 >= (short)uVar75) * uVar90;
                  auVar108._10_2_ =
                       (sVar49 < (short)uVar90) * uVar90 |
                       (ushort)(sVar49 >= (short)uVar90) * sVar49;
                  auVar108._12_2_ =
                       (ushort)(sVar48 < sVar49) * sVar49 | (ushort)(sVar48 >= sVar49) * sVar48;
                  auVar108._14_2_ = (ushort)(0 < sVar48) * sVar48;
                  auVar44 = pshuflw(auVar108,auVar108,0);
                  local_78._4_4_ = auVar44._0_4_;
                  local_78._0_4_ = local_78._4_4_;
                  local_78._8_4_ = local_78._4_4_;
                  local_78._12_4_ = local_78._4_4_;
                  uVar33 = uVar36 & 0xffffffff;
                }
                else {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                }
              }
LAB_0068d72d:
              if (!bVar10) goto LAB_0068d74f;
              uVar36 = uVar36 + 1;
              palVar19 = palVar38;
              palVar21 = local_1a8;
              palVar20 = ptr;
              palVar17 = palVar37;
              local_1b0 = palVar24;
            } while (uVar36 != iVar5 + 1U);
            uVar36 = (ulong)(iVar5 + 1U);
LAB_0068d74f:
            iVar32 = (int)uVar33;
            if ((short)local_1c8 == 0x7fff) {
LAB_0068d77f:
              *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
            }
            else {
              auVar109._0_2_ = -(ushort)(auVar102._0_2_ == 0x7fff);
              auVar109._2_2_ = -(ushort)(auVar102._2_2_ == 0x7fff);
              auVar109._4_2_ = -(ushort)(auVar102._4_2_ == 0x7fff);
              auVar109._6_2_ = -(ushort)(auVar102._6_2_ == 0x7fff);
              auVar109._8_2_ = -(ushort)(auVar102._8_2_ == 0x7fff);
              auVar109._10_2_ = -(ushort)(auVar102._10_2_ == 0x7fff);
              auVar109._12_2_ = -(ushort)(auVar102._12_2_ == 0x7fff);
              auVar109._14_2_ = -(ushort)(auVar102._14_2_ == 0x7fff);
              if ((((((((((((((((auVar109 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar109 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar109 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                              ) || (auVar109 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                            (auVar109 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar109 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar109 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar109 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar109 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar109 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar109 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar109 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar109 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar109 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar109._14_2_ >> 7 & 1) != 0) || (auVar109._14_2_ & 0x8000) != 0)
              goto LAB_0068d77f;
            }
            iVar16 = parasail_result_is_saturated(result_00);
            local_1d0 = palVar38;
            palVar19 = palVar37;
            if (iVar16 == 0) {
              palVar17 = b_00;
              palVar21 = palVar18;
              palVar20 = b;
              palVar14 = b_01;
              ptr_00 = local_1b8;
              ptr_01 = palVar24;
              ptr_02 = local_1c0;
              ptr_03 = local_1a0;
              if ((iVar32 != (int)uVar36 + -1) &&
                 (palVar17 = local_1c0, palVar21 = palVar24, palVar20 = local_1b8,
                 palVar14 = local_1a0, ptr_00 = b, ptr_01 = palVar18, ptr_02 = b_00, ptr_03 = b_01,
                 iVar32 == (int)uVar36 + -2)) {
                local_1d0 = palVar24;
                palVar17 = ptr;
                palVar21 = palVar38;
                palVar19 = local_1b8;
                ptr = local_1c0;
                palVar20 = palVar37;
                palVar14 = local_1a8;
                local_1a8 = local_1a0;
              }
              local_1a0 = palVar14;
              local_158 = SUB84(palVar17,0);
              uStack_154 = (undefined4)((ulong)palVar17 >> 0x20);
              if ((uVar23 + 7 & 0x7ffffff8) == 0) {
                iVar16 = 0;
                iVar22 = 0;
                iVar27 = 0;
              }
              else {
                sVar40 = -0x8000;
                uVar28 = 0;
                sVar39 = -0x8000;
                sVar48 = -0x8000;
                do {
                  if ((*(short *)((long)*palVar20 + uVar28 * 2) == (short)local_1c8) &&
                     (uVar34 = ((uint)uVar28 & 7) * uVar11 + ((uint)(uVar28 >> 3) & 0x1fffffff),
                     (int)uVar34 < (int)uVar23)) {
                    sVar40 = *(short *)((long)*palVar21 + uVar28 * 2);
                    sVar39 = *(short *)((long)*palVar17 + uVar28 * 2);
                    sVar48 = *(short *)((long)*local_1a0 + uVar28 * 2);
                    uVar23 = (ulong)uVar34;
                  }
                  uVar34 = (uint)uVar23;
                  uVar28 = uVar28 + 1;
                } while ((uVar11 & 0xfffffff) << 3 != (int)uVar28);
                iVar27 = sVar40 + 0x8000;
                iVar22 = sVar39 + 0x8000;
                iVar16 = sVar48 + 0x8000;
              }
              iVar31 = (short)local_1c8 + 0x8000;
            }
            else {
              iVar32 = 0;
              iVar16 = 0x8000;
              iVar22 = 0x8000;
              iVar27 = 0x8000;
              iVar31 = 0x8000;
              local_158 = SUB84(local_1c0,0);
              uStack_154 = (undefined4)((ulong)local_1c0 >> 0x20);
              uVar34 = 0;
              ptr_00 = b;
              ptr_01 = palVar18;
              ptr_02 = b_00;
              ptr_03 = b_01;
              palVar21 = palVar24;
              palVar20 = local_1b8;
            }
            result_00->score = iVar31;
            result_00->end_query = uVar34;
            result_00->end_ref = iVar32;
            ((result_00->field_4).stats)->matches = iVar27;
            ((result_00->field_4).stats)->similar = iVar22;
            ((result_00->field_4).stats)->length = iVar16;
            parasail_free(local_1a0);
            parasail_free((void *)CONCAT44(uStack_154,local_158));
            parasail_free(palVar21);
            parasail_free(palVar20);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(local_1a8);
            parasail_free(ptr_03);
            parasail_free(ptr);
            parasail_free(ptr_02);
            parasail_free(local_1d0);
            parasail_free(ptr_01);
            parasail_free(palVar19);
            parasail_free(ptr_00);
            ppVar30 = result_00;
            goto LAB_0068da52;
          }
          parasail_sw_stats_striped_profile_sse41_128_16_cold_1();
        }
      }
    }
  }
  ppVar30 = (parasail_result_t *)0x0;
LAB_0068da52:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  ppVar30->end_query = iVar15;
  ppVar30->end_ref = iVar5;
  return ppVar30;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_sse41_128_16(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_sse_128_16(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_sse41_128_16(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_sse_128_16(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_sse_128_16(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}